

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionProxy::HasValidNonProfileEntryPoint(FunctionProxy *this)

{
  JavascriptMethod codeAddress;
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  ProxyEntryPointInfo *pPVar4;
  JavascriptMethod p_Var5;
  FunctionBody *this_00;
  bool local_3b;
  bool local_3a;
  bool local_39;
  FunctionBody *body;
  JavascriptMethod originalEntryPoint;
  JavascriptMethod directEntryPoint;
  FunctionProxy *this_local;
  
  pPVar4 = GetDefaultEntryPointInfo(this);
  codeAddress = (JavascriptMethod)pPVar4->jsMethod;
  p_Var5 = GetOriginalEntryPoint_Unchecked(this);
  this_00 = GetFunctionBody(this);
  bVar1 = FunctionBody::GetIsAsmJsFunction(this_00);
  if (bVar1) {
    bVar1 = ParseableFunctionInfo::IsWasmFunction(&this_00->super_ParseableFunctionInfo);
    if ((bVar1) && (uVar2 = FunctionBody::GetByteCodeCount(this_00), uVar2 == 0)) {
      local_39 = codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk ||
                 codeAddress == WasmLibrary::WasmLazyTrapCallback;
      return local_39;
    }
    if ((codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk) ||
       (BVar3 = IsAsmJsCodeGenThunk(codeAddress), BVar3 != 0)) {
      return true;
    }
  }
  BVar3 = IsIntermediateCodeGenThunk(codeAddress);
  local_3a = true;
  if ((BVar3 == 0) && (local_3a = true, p_Var5 != codeAddress)) {
    local_3b = false;
    if (codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk) {
      BVar3 = FunctionBody::IsNativeOriginalEntryPoint(this_00);
      local_3b = BVar3 != 0;
    }
    local_3a = local_3b;
  }
  return local_3a;
}

Assistant:

bool FunctionProxy::HasValidNonProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        FunctionBody* body = this->GetFunctionBody();
        Unused(body); // in some configuration
#ifdef ASMJS_PLAT
        if (body->GetIsAsmJsFunction())
        {
#ifdef ENABLE_WASM
            if (body->IsWasmFunction() && body->GetByteCodeCount() == 0)
            {
                // The only valid 2 entrypoints if the function hasn't been parsed
                return directEntryPoint == AsmJsDefaultEntryThunk || directEntryPoint == WasmLibrary::WasmLazyTrapCallback;
            }
#endif
            // Entrypoints valid only for asm.js/wasm
            if (directEntryPoint == AsmJsDefaultEntryThunk || IsAsmJsCodeGenThunk(directEntryPoint))
            {
                return true;
            }
        }
#endif
        // Check the direct entry point to see if it is codegen thunk
        // if it is not, the background codegen thread has updated both original entry point and direct entry point
        // and they should still match, same as cases other then code gen
        return IsIntermediateCodeGenThunk(directEntryPoint) || originalEntryPoint == directEntryPoint
#if ENABLE_PROFILE_INFO
            || (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk && body->IsNativeOriginalEntryPoint())
#endif
            ;
    }